

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg_1.0.0.hpp
# Opt level: O0

undefined8 __thiscall svg::Font::toString_abi_cxx11_(Font *this,Layout *layout)

{
  ostream *poVar1;
  Layout *in_RDX;
  long in_RSI;
  undefined8 in_RDI;
  stringstream ss;
  allocator local_291;
  string local_290 [39];
  allocator local_269;
  string local_268 [32];
  string local_248 [39];
  allocator local_221;
  string local_220 [32];
  double local_200;
  allocator local_1e1;
  string local_1e0 [32];
  string local_1c0 [32];
  stringstream local_1a0 [16];
  ostream local_190 [104];
  string *in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  string *in_stack_fffffffffffffee8;
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e0,"font-size",&local_1e1);
  local_200 = translateScale(*(double *)(in_RSI + 8),in_RDX);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_220,"",&local_221);
  attribute<double>(in_stack_fffffffffffffee8,(double *)in_stack_fffffffffffffee0,
                    in_stack_fffffffffffffed8);
  poVar1 = std::operator<<(local_190,local_1c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_268,"font-family",&local_269);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_290,"",&local_291);
  attribute<std::__cxx11::string>
            (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  std::operator<<(poVar1,local_248);
  std::__cxx11::string::~string(local_248);
  std::__cxx11::string::~string(local_290);
  std::allocator<char>::~allocator((allocator<char> *)&local_291);
  std::__cxx11::string::~string(local_268);
  std::allocator<char>::~allocator((allocator<char> *)&local_269);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return in_RDI;
}

Assistant:

std::string toString(Layout const & layout) const
        {
            std::stringstream ss;
            ss << attribute("font-size", translateScale(size, layout)) << attribute("font-family", family);
            return ss.str();
        }